

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O0

string * CLI::clean_name_string(string *name,string *keyChars)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  string local_38;
  string *local_18;
  string *keyChars_local;
  string *name_local;
  
  local_18 = keyChars;
  keyChars_local = name;
  lVar2 = ::std::__cxx11::string::find_first_of((string *)name,(ulong)keyChars);
  if ((lVar2 != -1) ||
     (((pcVar3 = (char *)::std::__cxx11::string::front(), *pcVar3 == '[' &&
       (pcVar3 = (char *)::std::__cxx11::string::back(), *pcVar3 == ']')) ||
      (lVar2 = ::std::__cxx11::string::find_first_of((char *)keyChars_local,0x1597f6), lVar2 != -1))
     )) {
    lVar2 = ::std::__cxx11::string::find_first_of((char)keyChars_local,0x27);
    if (lVar2 == -1) {
      ::std::__cxx11::string::insert((ulong)keyChars_local,0,'\x01');
      ::std::__cxx11::string::push_back((char)keyChars_local);
    }
    else {
      bVar1 = detail::has_escapable_character(keyChars_local);
      if (bVar1) {
        detail::add_escaped_characters(&local_38,keyChars_local);
        ::std::__cxx11::string::operator=((string *)keyChars_local,(string *)&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
      }
      ::std::__cxx11::string::insert((ulong)keyChars_local,0,'\x01');
      ::std::__cxx11::string::push_back((char)keyChars_local);
    }
  }
  return keyChars_local;
}

Assistant:

CLI11_INLINE std::string &clean_name_string(std::string &name, const std::string &keyChars) {
    if(name.find_first_of(keyChars) != std::string::npos || (name.front() == '[' && name.back() == ']') ||
       (name.find_first_of("'`\"\\") != std::string::npos)) {
        if(name.find_first_of('\'') == std::string::npos) {
            name.insert(0, 1, '\'');
            name.push_back('\'');
        } else {
            if(detail::has_escapable_character(name)) {
                name = detail::add_escaped_characters(name);
            }
            name.insert(0, 1, '\"');
            name.push_back('\"');
        }
    }
    return name;
}